

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O1

void ylt::metric::detail::stat_metric(void)

{
  atomic<long> value;
  element_type *peVar1;
  int iVar2;
  atomic<std::atomic<long>_*> *t;
  pointer paVar3;
  string *psVar4;
  long value_00;
  long *local_38 [2];
  long local_28 [2];
  
  if (stat_metric()::user_metric_count == '\0') {
    iVar2 = __cxa_guard_acquire(&stat_metric()::user_metric_count);
    if (iVar2 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"ylt_user_metric_count","")
      ;
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_metric::user_metric_count,psVar4);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_metric::user_metric_count,&__dso_handle);
      __cxa_guard_release(&stat_metric()::user_metric_count);
    }
  }
  peVar1 = stat_metric::user_metric_count.
           super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  value.super___atomic_base<long>._M_i =
       metric_t::g_user_metric_count.super___atomic_base<long>._M_i;
  if (((stat_metric::user_metric_count.
        super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->super_basic_static_counter<long>).has_change_ == false) {
    ((stat_metric::user_metric_count.
      super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->super_basic_static_counter<long>).has_change_ = true;
  }
  thread_local_value<long>::update
            (&(peVar1->super_basic_static_counter<long>).default_label_value_,
             (long)value.super___atomic_base<long>._M_i);
  if (stat_metric()::user_metric_label_count == '\0') {
    iVar2 = __cxa_guard_acquire(&stat_metric()::user_metric_label_count);
    if (iVar2 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,"ylt_user_metric_labels","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_metric::user_metric_label_count,psVar4);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_metric::user_metric_label_count,&__dso_handle);
      __cxa_guard_release(&stat_metric()::user_metric_label_count);
    }
  }
  peVar1 = stat_metric::user_metric_label_count.
           super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  value_00 = 0;
  for (paVar3 = (dynamic_metric::g_user_metric_label_count->duplicates_).
                super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar3 != (dynamic_metric::g_user_metric_label_count->duplicates_).
                super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; paVar3 = paVar3 + 1) {
    if ((paVar3->_M_b)._M_p != (__pointer_type)0x0) {
      value_00 = value_00 + (((paVar3->_M_b)._M_p)->super___atomic_base<long>)._M_i;
    }
  }
  if (((stat_metric::user_metric_label_count.
        super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->super_basic_static_counter<long>).has_change_ == false) {
    ((stat_metric::user_metric_label_count.
      super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->super_basic_static_counter<long>).has_change_ = true;
  }
  thread_local_value<long>::update
            (&(peVar1->super_basic_static_counter<long>).default_label_value_,value_00);
  return;
}

Assistant:

inline void stat_metric() {
  static auto user_metric_count =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_user_metric_count");
  user_metric_count->update(metric::metric_t::g_user_metric_count);

  static auto user_metric_label_count =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_user_metric_labels");
  user_metric_label_count->update(
      dynamic_metric::g_user_metric_label_count->value());
}